

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O3

void iutest::TestEnv::ReleaseGlobalTestEnvironment(void)

{
  pointer __src;
  pointer __dest;
  Environment *pEVar1;
  Variable *pVVar2;
  pointer ppEVar3;
  
  pVVar2 = get_vars();
  __dest = (pVVar2->m_environment_list).
           super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>._M_impl
           .super__Vector_impl_data._M_start;
  pVVar2 = get_vars();
  if (__dest != (pVVar2->m_environment_list).
                super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    __src = __dest + 1;
    do {
      pEVar1 = *__dest;
      pVVar2 = get_vars();
      ppEVar3 = (pVVar2->m_environment_list).
                super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (__src != ppEVar3) {
        memmove(__dest,__src,(long)ppEVar3 - (long)__src);
        ppEVar3 = (pVVar2->m_environment_list).
                  super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      (pVVar2->m_environment_list).
      super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppEVar3 + -1;
      if (pEVar1 != (Environment *)0x0) {
        (**(code **)(*(long *)pEVar1 + 8))(pEVar1);
      }
      pVVar2 = get_vars();
    } while (__dest != (pVVar2->m_environment_list).
                       super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

static iuEnvironmentList& environments() { return get_vars().m_environment_list; }